

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2FindAndConsume(void)

{
  bool bVar1;
  int iVar2;
  Arg *args [1];
  string word;
  string s;
  RE2 r;
  StringPiece local_2e8;
  Arg *local_2d8;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [16];
  char *local_2b0;
  int local_2a8;
  char local_2a0 [16];
  undefined1 local_290 [384];
  RE2 local_110;
  
  RE2::RE2(&local_110,"(\\w+)");
  local_2c8 = 0;
  local_2c0[0] = 0;
  local_2d0 = local_2c0;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"   aaa b!@#$@#$cccc","");
  local_2e8.ptr_ = local_2b0;
  local_2e8.length_ = local_2a8;
  local_290._0_8_ = &local_2d0;
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  bVar1 = RE2::FindAndConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x115,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::FindAndConsume(&input, r, &word)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x116,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: (word) == (\"aaa\")",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  local_290._0_8_ = &local_2d0;
  bVar1 = RE2::FindAndConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x117,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::FindAndConsume(&input, r, &word)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x118,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: (word) == (\"b\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  local_290._0_8_ = &local_2d0;
  bVar1 = RE2::FindAndConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x119,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::FindAndConsume(&input, r, &word)",0x33
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: (word) == (\"cccc\")",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._8_8_ = RE2::Arg::parse_string;
  local_2d8 = (Arg *)local_290;
  local_290._0_8_ = &local_2d0;
  bVar1 = RE2::FindAndConsumeN(&local_2e8,&local_110,&local_2d8,1);
  if (bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: ! RE2::FindAndConsume(&input, r, &word)",
               0x35);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_2e8.ptr_ = "aaa";
  local_2e8.length_ = 3;
  RE2::RE2((RE2 *)local_290,"aaa");
  bVar1 = RE2::FindAndConsumeN(&local_2e8,(RE2 *)local_290,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)local_290);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x121,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: RE2::FindAndConsume(&input, \"aaa\")",0x30)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  local_290._0_8_ = "";
  local_290._8_8_ = local_290._8_8_ & 0xffffffff00000000;
  bVar1 = StringPiece::_equal(&local_2e8,(StringPiece *)local_290);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x122,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_290 + 8),"Check failed: (input) == (\"\")",0x1d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_290);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0);
  }
  RE2::~RE2(&local_110);
  return;
}

Assistant:

TEST(RE2, FindAndConsume) {
  VLOG(1) << "TestFindAndConsume";

  RE2 r("(\\w+)");      // matches a word
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "aaa");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "b");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "cccc");
  CHECK(! RE2::FindAndConsume(&input, r, &word));

  // Check that FindAndConsume works without any submatches.
  // Earlier version used uninitialized data for
  // length to consume.
  input = "aaa";
  CHECK(RE2::FindAndConsume(&input, "aaa"));
  CHECK_EQ(input, "");
}